

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O1

char * xc_functional_get_name(int number)

{
  xc_functional_key_t *pxVar1;
  size_t sVar2;
  char *pcVar3;
  xc_functional_key_t *__s;
  
  __s = xc_functional_keys;
  if (xc_functional_keys[0].number == -1) {
    return (char *)0x0;
  }
  if (xc_functional_keys[0].number != number) {
    __s = xc_functional_keys;
    do {
      pxVar1 = __s + 1;
      if (pxVar1->number == -1) {
        return (char *)0x0;
      }
      __s = __s + 1;
    } while (pxVar1->number != number);
  }
  sVar2 = strlen(__s->name);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pcVar3 = strcpy(pcVar3,__s->name);
  return pcVar3;
}

Assistant:

char *xc_functional_get_name(int number)
{
  int ii;
  char *p;

  for(ii=0;;ii++){
    if(xc_functional_keys[ii].number == -1)
      return NULL;
    if(xc_functional_keys[ii].number == number) {
      /* return duplicated: caller has the responsibility to dealloc string.
         Do this the old way since strdup and strndup aren't C standard. */
      p = (char *) libxc_malloc(strlen(xc_functional_keys[ii].name) + 1);
      strcpy(p,xc_functional_keys[ii].name);
      return p;
    }
  }
}